

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::LoadUSDCFromFile
               (string *_filename,Stage *stage,string *warn,string *err,USDLoadOptions *options)

{
  bool bVar1;
  char *__lhs;
  string *psVar2;
  string _err;
  string filepath;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  MMapFileHandle handle;
  string local_d0;
  Stage *local_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  MMapFileHandle local_68;
  
  io::ExpandFilePath(&local_a8,(string *)_filename,(void *)0x0);
  bVar1 = io::IsMMapSupported();
  if (bVar1) {
    local_68.filename._M_dataplus._M_p = (pointer)&local_68.filename.field_2;
    local_68.filename._M_string_length = 0;
    local_68.filename.field_2._M_local_buf[0] = '\0';
    local_68.writable = false;
    local_68.addr = (uint8_t *)0x0;
    local_68.size = 0;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_b0 = stage;
    bVar1 = io::MMapFile(&local_a8,&local_68,false,&local_d0);
    if (bVar1) {
      if ((warn != (string *)0x0) && (local_d0._M_string_length != 0)) {
        ::std::operator+(&local_88,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d0,"\n");
        psVar2 = warn;
LAB_00114ff4:
        ::std::__cxx11::string::append((string *)psVar2);
        ::std::__cxx11::string::_M_dispose();
      }
    }
    else if (err != (string *)0x0) {
      ::std::operator+(&local_88,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_d0,"\n");
      psVar2 = err;
      goto LAB_00114ff4;
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar1) {
      bVar1 = LoadUSDCFromMemory(local_68.addr,local_68.size,(string *)&local_a8,local_b0,warn,err,
                                 options);
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      io::UnmapFile(&local_68,&local_d0);
      if ((warn != (string *)0x0) && (local_d0._M_string_length != 0)) {
        ::std::operator+(&local_88,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d0,"\n");
        ::std::__cxx11::string::append((string *)warn);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      bVar1 = false;
    }
    ::std::__cxx11::string::_M_dispose();
    goto LAB_00115122;
  }
  local_88.field_2._M_allocated_capacity = 0;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,
                            (string *)err,&local_a8,(long)options->max_memory_limit_in_mb << 0x14,
                            (void *)0x0);
  if (bVar1) {
    if (local_88._M_string_length - (long)local_88._M_dataplus._M_p < 0x58) {
      if (err != (string *)0x0) {
        __lhs = "File size too short. Looks like this file is not a USDC : \"";
        goto LAB_001150a9;
      }
      goto LAB_001150ed;
    }
    bVar1 = LoadUSDCFromMemory((uint8_t *)local_88._M_dataplus._M_p,
                               local_88._M_string_length - (long)local_88._M_dataplus._M_p,
                               (string *)&local_a8,stage,warn,err,options);
  }
  else {
    if (err != (string *)0x0) {
      __lhs = "File not found or failed to read : \"";
LAB_001150a9:
      ::std::operator+(&local_d0,__lhs,&local_a8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_68,&local_d0,"\"\n");
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
LAB_001150ed:
    bVar1 = false;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
LAB_00115122:
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool LoadUSDCFromFile(const std::string &_filename, Stage *stage,
                      std::string *warn, std::string *err,
                      const USDLoadOptions &options) {
  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);

  if (io::IsMMapSupported()) {
    io::MMapFileHandle handle;
    
    {
      std::string _err;
      if (!io::MMapFile(filepath, &handle, /* writable */false, &_err)) {
        if (err) {
          (*err) += _err + "\n";
        }
        return false; 
      }

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    bool ret = LoadUSDCFromMemory(handle.addr, size_t(handle.size), filepath, stage, warn,
                              err, options);

    {
      std::string _err;
      // Ignore unmap result for now.
      io::UnmapFile(handle, &_err);

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    return ret;

  } else {
    std::vector<uint8_t> data;
    size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
    if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                           /* userdata */ nullptr)) {
      if (err) {
        (*err) += "File not found or failed to read : \"" + filepath + "\"\n";
      }

      return false;
    }

    DCOUT("File size: " + std::to_string(data.size()) + " bytes.");

    if (data.size() < (11 * 8)) {
      // ???
      if (err) {
        (*err) += "File size too short. Looks like this file is not a USDC : \"" +
                  filepath + "\"\n";
      }
      return false;
    }

    return LoadUSDCFromMemory(data.data(), data.size(), filepath, stage, warn,
                              err, options);
  }
}